

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O0

Point3f pbrt::OffsetRayOrigin(Point3fi pi,Normal3f n,Vector3f w)

{
  Tuple3<pbrt::Point3,_float> TVar1;
  float *pfVar2;
  type tVar3;
  float fVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 in_XMM2 [16];
  Normal3<float> NVar11;
  Vector3f VVar12;
  Vector3<float> VVar13;
  Point3<float> PVar14;
  int i;
  Vector3f offset;
  Float d;
  Point3f po;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffed0;
  undefined1 *puVar15;
  Point3<pbrt::Interval<float>_> *p;
  Tuple3<pbrt::Normal3,_float> *t;
  undefined4 in_stack_fffffffffffffee8;
  Point3fi *in_stack_fffffffffffffef0;
  int local_f4;
  undefined1 local_dc [12];
  Tuple3<pbrt::Vector3,_float> local_d0;
  Tuple3<pbrt::Vector3,_float> local_bc;
  Tuple3<pbrt::Vector3,_float> local_b0;
  undefined1 local_a0 [12];
  Tuple3<pbrt::Vector3,_float> local_94;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  type local_4c;
  undefined8 local_48;
  undefined8 local_38;
  Tuple3<pbrt::Normal3,_float> local_28;
  Tuple3<pbrt::Normal3,_float> local_18;
  Tuple3<pbrt::Point3,_float> local_c;
  
  auVar10 = in_ZMM0._8_56_;
  p = (Point3<pbrt::Interval<float>_> *)&stack0x00000008;
  local_28._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_48 = vmovlpd_avx(in_XMM2);
  t = &local_18;
  local_38 = local_48;
  local_18._0_8_ = local_28._0_8_;
  NVar11 = Abs<pbrt::Normal3,float>(t);
  local_60 = NVar11.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar5._0_8_ = NVar11.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar5._8_56_ = auVar10;
  local_68 = vmovlpd_avx(auVar5._0_16_);
  local_58 = local_68;
  local_50 = local_60;
  VVar12 = Point3fi::Error(in_stack_fffffffffffffef0);
  local_80 = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar10;
  local_88 = vmovlpd_avx(auVar6._0_16_);
  local_78 = local_88;
  local_70 = local_80;
  tVar3 = Dot<float>((Normal3<float> *)in_stack_fffffffffffffed0,
                     (Vector3<float> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                    );
  fVar4 = (float)((ulong)local_a0 >> 0x20);
  local_4c = tVar3;
  Vector3<float>::Vector3<float>
            ((Vector3<float> *)in_stack_fffffffffffffed0,
             (Normal3<float> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  auVar10 = (undefined1  [56])0x0;
  VVar13 = operator*(fVar4,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(tVar3,in_stack_fffffffffffffee8)
                    );
  local_b0.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar10;
  local_b0._0_8_ = vmovlpd_avx(auVar7._0_16_);
  local_94._0_8_ = local_b0._0_8_;
  local_94.z = local_b0.z;
  tVar3 = Dot<float>((Vector3<float> *)in_stack_fffffffffffffed0,
                     (Normal3<float> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                    );
  auVar10 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  if (tVar3 < 0.0) {
    VVar13 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffed0);
    local_d0.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar10;
    local_d0._0_8_ = vmovlpd_avx(auVar8._0_16_);
    local_bc._0_8_ = local_d0._0_8_;
    local_bc.z = local_d0.z;
    local_94._0_8_ = local_d0._0_8_;
    local_94.z = local_d0.z;
  }
  puVar15 = local_dc;
  Point3<float>::Point3<pbrt::Interval<float>>((Point3<float> *)t,p);
  PVar14 = Point3<float>::operator+((Point3<float> *)t,(Vector3<float> *)p);
  local_c.z = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  local_c._0_8_ = vmovlpd_avx(auVar9._0_16_);
  for (local_f4 = 0; local_f4 < 3; local_f4 = local_f4 + 1) {
    pfVar2 = Tuple3<pbrt::Vector3,_float>::operator[](&local_94,local_f4);
    if (*pfVar2 <= 0.0) {
      pfVar2 = Tuple3<pbrt::Vector3,_float>::operator[](&local_94,local_f4);
      if (*pfVar2 < 0.0) {
        Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_f4);
        fVar4 = NextFloatDown(SUB84(puVar15,0));
        pfVar2 = Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_f4);
        *pfVar2 = fVar4;
      }
    }
    else {
      Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_f4);
      fVar4 = NextFloatUp(SUB84(puVar15,0));
      pfVar2 = Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_f4);
      *pfVar2 = fVar4;
    }
  }
  TVar1.z = local_c.z;
  TVar1.x = local_c.x;
  TVar1.y = local_c.y;
  return (Point3f)TVar1;
}

Assistant:

PBRT_CPU_GPU inline Point3f OffsetRayOrigin(Point3fi pi, Normal3f n, Vector3f w) {
    // Find vector _offset_ to corner of error bounds and compute initial _po_
    Float d = Dot(Abs(n), pi.Error());
    Vector3f offset = d * Vector3f(n);
    if (Dot(w, n) < 0)
        offset = -offset;
    Point3f po = Point3f(pi) + offset;

    // Round offset point _po_ away from _p_
    for (int i = 0; i < 3; ++i) {
        if (offset[i] > 0)
            po[i] = NextFloatUp(po[i]);
        else if (offset[i] < 0)
            po[i] = NextFloatDown(po[i]);
    }

    return po;
}